

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Errno.cpp
# Opt level: O0

string * __thiscall
llvm::sys::StrError_abi_cxx11_(string *__return_storage_ptr__,sys *this,int errnum)

{
  char *pcVar1;
  char local_7f8 [8];
  char buffer [2000];
  int MaxErrStrLen;
  int errnum_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((int)this != 0) {
    local_7f8[0] = '\0';
    pcVar1 = strerror_r((int)this,local_7f8,1999);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StrError(int errnum) {
  std::string str;
  if (errnum == 0)
    return str;
#if defined(HAVE_STRERROR_R) || HAVE_DECL_STRERROR_S
  const int MaxErrStrLen = 2000;
  char buffer[MaxErrStrLen];
  buffer[0] = '\0';
#endif

#ifdef HAVE_STRERROR_R
  // strerror_r is thread-safe.
#if defined(__GLIBC__) && defined(_GNU_SOURCE)
  // glibc defines its own incompatible version of strerror_r
  // which may not use the buffer supplied.
  str = strerror_r(errnum, buffer, MaxErrStrLen - 1);
#else
  strerror_r(errnum, buffer, MaxErrStrLen - 1);
  str = buffer;
#endif
#elif HAVE_DECL_STRERROR_S // "Windows Secure API"
  strerror_s(buffer, MaxErrStrLen - 1, errnum);
  str = buffer;
#elif defined(HAVE_STRERROR)
  // Copy the thread un-safe result of strerror into
  // the buffer as fast as possible to minimize impact
  // of collision of strerror in multiple threads.
  str = strerror(errnum);
#else
  // Strange that this system doesn't even have strerror
  // but, oh well, just use a generic message
  raw_string_ostream stream(str);
  stream << "Error #" << errnum;
  stream.flush();
#endif
  return str;
}